

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O0

void map_dungeon(dungeon_map *map,uint8_t x,uint8_t y,BOOL have_keys)

{
  BOOL BVar1;
  dw_warp warp;
  BOOL have_keys_local;
  uint8_t y_local;
  uint8_t x_local;
  dungeon_map *map_local;
  
  if ((((map != (dungeon_map *)0x0) && (BVar1 = map_ob(map,(uint)x,(uint)y), BVar1 == FALSE)) &&
      ((map->tiles[x][y] & 8) == 0)) &&
     (BVar1 = tile_is_walkable((uint)map->tiles[x][y],have_keys), BVar1 != FALSE)) {
    map->tiles[x][y] = map->tiles[x][y] | 8;
    if ((map->tiles[x][y] == '\t') || (map->tiles[x][y] == '\v')) {
      follow_warp(map,x,y,have_keys);
    }
    map_dungeon(map,x + 0xff,y,have_keys);
    map_dungeon(map,x + '\x01',y,have_keys);
    map_dungeon(map,x,y + 0xff,have_keys);
    map_dungeon(map,x,y + '\x01',have_keys);
  }
  return;
}

Assistant:

static void map_dungeon(dungeon_map *map, uint8_t x, uint8_t y, BOOL have_keys)
{
    dw_warp warp;

    if (!map)
        return;

    if (map_ob(map, x, y))
        return;

    if (map->tiles[x][y] & 0x8)
        return;

    if (!tile_is_walkable(map->tiles[x][y], have_keys))
        return;

    map->tiles[x][y] |= 0x8;
    if (map->tiles[x][y] == (DUNGEON_TILE_STAIRS_UP | 0x8) ||
        map->tiles[x][y] == (DUNGEON_TILE_STAIRS_DOWN | 0x8)) {
        follow_warp(map, x, y, have_keys);
    }
    map_dungeon(map, x-1, y, have_keys);
    map_dungeon(map, x+1, y, have_keys);
    map_dungeon(map, x, y-1, have_keys);
    map_dungeon(map, x, y+1, have_keys);


}